

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O1

void longvectorN(fft_data *sig,int N,int *array,int tx)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  if (0 < tx) {
    uVar2 = (ulong)(uint)tx;
    uVar10 = 0;
    iVar3 = 0;
    iVar5 = 1;
    do {
      uVar9 = ~uVar10;
      iVar1 = array[uVar2 + uVar9];
      if (0 < iVar5) {
        iVar6 = 0;
        do {
          if (1 < array[uVar2 + uVar9]) {
            pdVar8 = &sig[iVar3].im;
            iVar7 = 0;
            iVar4 = iVar6;
            do {
              iVar7 = iVar7 + 1;
              dVar11 = (double)iVar4 * (-6.283185307179586 / (double)(iVar1 * iVar5));
              dVar12 = cos(dVar11);
              ((fft_data *)(pdVar8 + -1))->re = dVar12;
              dVar11 = sin(dVar11);
              *pdVar8 = dVar11;
              pdVar8 = pdVar8 + 2;
              iVar4 = iVar4 + iVar6;
            } while (iVar7 < array[uVar2 + uVar9] + -1);
            iVar3 = iVar3 + iVar7;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar5);
      }
      uVar10 = uVar10 + 1;
      iVar5 = iVar1 * iVar5;
    } while (uVar10 != uVar2);
  }
  return;
}

Assistant:

void longvectorN(fft_data *sig,int N, int *array, int tx) {
	int L,i,Ls,ct,j,k;
	fft_type theta;
	L = 1;
	ct = 0;
	for (i = 0; i < tx; i++) {
		L = L * array[tx-1-i];
		Ls = L / array[tx-1-i];
		theta = -1.0 * PI2/L;
		for (j = 0; j < Ls;j++) {
			for (k = 0; k < array[tx-1-i] -1 ;k++) {
				sig[ct].re = cos((k+1)*j*theta);
				sig[ct].im = sin((k+1)*j*theta);
				ct++;
			}
		}

	}

}